

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O1

Reader __thiscall capnp::schema::Node::Reader::getDisplayName(Reader *this)

{
  StringPtr SVar1;
  PointerReader local_20;
  
  if ((this->_reader).pointerCount == 0) {
    local_20.nestingLimit = 0x7fffffff;
    local_20.capTable = (CapTableReader *)0x0;
    local_20.pointer = (WirePointer *)0x0;
    local_20.segment = (SegmentReader *)0x0;
  }
  else {
    local_20.segment = (this->_reader).segment;
    local_20.capTable = (this->_reader).capTable;
    local_20.pointer = (this->_reader).pointers;
    local_20.nestingLimit = (this->_reader).nestingLimit;
  }
  SVar1.content =
       (ArrayPtr<const_char>)_::PointerReader::getBlob<capnp::Text>(&local_20,(void *)0x0,0);
  return (StringPtr)(StringPtr)SVar1.content;
}

Assistant:

inline PointerReader StructReader::getPointerField(StructPointerOffset ptrIndex) const {
  if (ptrIndex < pointerCount) {
    // Hacky because WirePointer is defined in the .c++ file (so is incomplete here).
    return PointerReader(segment, capTable, reinterpret_cast<const WirePointer*>(
        reinterpret_cast<const word*>(pointers) + ptrIndex * WORDS_PER_POINTER), nestingLimit);
  } else{
    return PointerReader();
  }
}